

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RootObjectBase.cpp
# Opt level: O0

uint __thiscall
Js::RootObjectBase::ReleaseInlineCache
          (RootObjectBase *this,PropertyId propertyId,bool isLoadMethod,bool isStore,bool isShutdown
          )

{
  code *pcVar1;
  anon_class_32_4_e754b6a4 fn;
  bool bVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar3;
  undefined4 *puVar4;
  WriteBarrierPtr *local_68;
  WriteBarrierPtr *local_60;
  undefined7 uStack_47;
  bool local_29;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBStack_28;
  bool found;
  RootObjectInlineCacheMap *inlineCacheMap;
  undefined1 local_17;
  undefined1 local_16;
  undefined1 local_15;
  uint unregisteredInlineCacheCount;
  bool isShutdown_local;
  bool isStore_local;
  bool isLoadMethod_local;
  RootObjectBase *pRStack_10;
  PropertyId propertyId_local;
  RootObjectBase *this_local;
  
  inlineCacheMap._4_4_ = 0;
  if (isStore) {
    local_60 = (WriteBarrierPtr *)&this->storeInlineCacheMap;
  }
  else {
    if (isLoadMethod) {
      local_68 = (WriteBarrierPtr *)&this->loadMethodInlineCacheMap;
    }
    else {
      local_68 = (WriteBarrierPtr *)&this->loadInlineCacheMap;
    }
    local_60 = local_68;
  }
  local_17 = isShutdown;
  local_16 = isStore;
  local_15 = isLoadMethod;
  unregisteredInlineCacheCount = propertyId;
  pRStack_10 = this;
  ppBVar3 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__(local_60);
  pBStack_28 = *ppBVar3;
  local_29 = false;
  fn._8_8_ = CONCAT71(uStack_47,local_17) & 0xffffffffffffff01;
  fn.this = this;
  fn.unregisteredInlineCacheCount = (uint *)((long)&inlineCacheMap + 4);
  fn.found = &local_29;
  JsUtil::
  BaseDictionary<Js::PropertyRecord_const*,Js::RootObjectInlineCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::RemoveIfWithKey<int,Js::RootObjectBase::ReleaseInlineCache(int,bool,bool,bool)::__0>
            ((BaseDictionary<Js::PropertyRecord_const*,Js::RootObjectInlineCache*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)pBStack_28,(int *)&unregisteredInlineCacheCount,fn);
  if ((local_29 & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RootObjectBase.cpp"
                                ,0x72,"(found)","found");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  return inlineCacheMap._4_4_;
}

Assistant:

uint
    RootObjectBase::ReleaseInlineCache(Js::PropertyId propertyId, bool isLoadMethod, bool isStore, bool isShutdown)
    {
        uint unregisteredInlineCacheCount = 0;

        RootObjectInlineCacheMap * inlineCacheMap = isStore ? storeInlineCacheMap :
            isLoadMethod ? loadMethodInlineCacheMap : loadInlineCacheMap;
        bool found = false;
        inlineCacheMap->RemoveIfWithKey(propertyId,
            [this, isShutdown, &unregisteredInlineCacheCount, &found](PropertyRecord const * propertyRecord, RootObjectInlineCache * rootObjectInlineCache)
            {
                found = true;
                if (rootObjectInlineCache->Release() == 0)
                {
                    // If we're not shutting down, we need to remove this cache from thread context's invalidation list (if any),
                    // and release memory back to the arena.  During script context shutdown, we leave everything in place, because
                    // the inline cache arena will stay alive until script context is destroyed (as in destructor called as opposed to
                    // Close called) and thus the invalidation lists are safe to keep references to caches from this script context.
                    if (!isShutdown)
                    {
                        if (rootObjectInlineCache->GetInlineCache()->RemoveFromInvalidationList())
                        {
                            unregisteredInlineCacheCount++;

                        }
                        AllocatorDelete(InlineCacheAllocator, this->GetScriptContext()->GetInlineCacheAllocator(), rootObjectInlineCache->GetInlineCache());
                    }
                    return true; // Remove from the map
                }
                return false; // don't remove from the map
            }
        );
        Assert(found);
        return unregisteredInlineCacheCount;
    }